

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::JsonOutput::visitLogicProgramStats(JsonOutput *this,LpStats *lp)

{
  uint32 uVar1;
  uint32 uVar2;
  CRef_t puVar3;
  CRef_t puVar4;
  LpStats *in_RSI;
  LpStats *in_RDI;
  JsonOutput *unaff_retaddr;
  uint32 i_1;
  uint32 i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  uint32 k;
  undefined4 in_stack_ffffffffffffffec;
  uint32 t;
  uint32 k_00;
  
  pushObject((JsonOutput *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (ObjType)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  pushObject((JsonOutput *)in_RSI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (ObjType)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  Asp::RuleStats::sum(in_RDI->rules);
  printKeyValue((JsonOutput *)in_RDI,
                (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  Asp::RuleStats::sum(in_RDI->rules);
  printKeyValue((JsonOutput *)in_RDI,
                (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  t = 0;
  while (k_00 = t, uVar1 = Asp::RuleStats::numKeys(), t != uVar1) {
    if ((k_00 != 0) && (puVar3 = Asp::RuleStats::operator[](in_RSI->rules,k_00), *puVar3 != 0)) {
      Asp::RuleStats::toStr(t);
      pushObject((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,in_stack_ffffffffffffffe8),
                 (ObjType)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
      Asp::RuleStats::operator[](in_RSI->rules,k_00);
      printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
      Asp::RuleStats::operator[]((RuleStats *)((long)&((Output *)in_RSI->rules)->time_ + 4),k_00);
      printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
      popObject(unaff_retaddr);
    }
    t = k_00 + 1;
  }
  popObject(unaff_retaddr);
  printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
  if (in_RSI->auxAtoms != 0) {
    printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
  }
  if ((int)*(size_type *)in_RSI->disjunctions != 0) {
    pushObject((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,in_stack_ffffffffffffffe8),
               (ObjType)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
    printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
    popObject(unaff_retaddr);
  }
  pushObject((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,in_stack_ffffffffffffffe8),
             (ObjType)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  Asp::BodyStats::sum((BodyStats *)in_RDI);
  printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
  Asp::BodyStats::sum((BodyStats *)in_RDI);
  printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,in_stack_ffffffffffffffd8),0);
  uVar1 = 1;
  while (k = uVar1, uVar2 = Asp::BodyStats::numKeys(), uVar1 != uVar2) {
    puVar4 = Asp::BodyStats::operator[](in_RSI->bodies,k);
    if (*puVar4 != 0) {
      Asp::BodyStats::toStr(t);
      pushObject((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,k),(ObjType)((ulong)in_RDI >> 0x20),
                 SUB81((ulong)in_RDI >> 0x18,0));
      Asp::BodyStats::operator[](in_RSI->bodies,k);
      printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
      Asp::BodyStats::operator[](in_RSI->bodies + 1,k);
      printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
      popObject(unaff_retaddr);
    }
    uVar1 = k + 1;
  }
  popObject(unaff_retaddr);
  if (*(int *)&in_RSI->sccs == 0) {
    printKeyValue((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,k),(char *)in_RDI);
  }
  else if (*(int *)&in_RSI->sccs == 0x7ffffff) {
    printKeyValue((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,k),(char *)in_RDI);
  }
  else {
    printKeyValue((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,k),(char *)in_RDI);
    printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
    printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
    printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
    printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
  }
  pushObject((JsonOutput *)in_RSI,(char *)CONCAT44(k_00,k),(ObjType)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  Asp::LpStats::eqs(in_RDI);
  printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
  Asp::LpStats::eqs(in_RSI,Atom);
  printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
  Asp::LpStats::eqs(in_RSI,Body);
  printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
  Asp::LpStats::eqs(in_RSI,Hybrid);
  printKeyValue((JsonOutput *)in_RDI,(char *)CONCAT44(t,uVar1),0);
  popObject(unaff_retaddr);
  popObject(unaff_retaddr);
  return;
}

Assistant:

void JsonOutput::visitLogicProgramStats(const Asp::LpStats& lp) {
	using namespace Asp;
	pushObject("LP");
	pushObject("Rules");
	printKeyValue("Original", lp.rules[0].sum());
	printKeyValue("Final",    lp.rules[1].sum());
	for (uint32 i = 0; i != RuleStats::numKeys(); ++i) {
		if (i != RuleStats::Normal && lp.rules[0][i]) {
			pushObject(RuleStats::toStr(i));
			printKeyValue("Original", lp.rules[0][i]);
			printKeyValue("Final",    lp.rules[1][i]);
			popObject();
		}
	}
	popObject(); // Rules
	printKeyValue("Atoms", lp.atoms);
	if (lp.auxAtoms) { printKeyValue("AuxAtoms", lp.auxAtoms); }
	if (lp.disjunctions[0]) {
		pushObject("Disjunctions");
		printKeyValue("Original", lp.disjunctions[0]);
		printKeyValue("Final", lp.disjunctions[1]);
		popObject();
	}
	pushObject("Bodies");
	printKeyValue("Original", lp.bodies[0].sum());
	printKeyValue("Final"   , lp.bodies[1].sum());
	for (uint32 i = 1; i != BodyStats::numKeys(); ++i) {
		if (lp.bodies[0][i]) {
			pushObject(BodyStats::toStr(i));
			printKeyValue("Original", lp.bodies[0][i]);
			printKeyValue("Final",    lp.bodies[1][i]);
			popObject();
		}
	}
	popObject();
	if      (lp.sccs == 0)              { printKeyValue("Tight", "yes"); }
	else if (lp.sccs == PrgNode::noScc) { printKeyValue("Tight", "N/A"); }
	else                                {
		printKeyValue("Tight", "no");
		printKeyValue("SCCs", lp.sccs);
		printKeyValue("NonHcfs", lp.nonHcfs);
		printKeyValue("UfsNodes", lp.ufsNodes);
		printKeyValue("NonHcfGammas", lp.gammas);
	}
	pushObject("Equivalences");
	printKeyValue("Sum", lp.eqs());
	printKeyValue("Atom", lp.eqs(Var_t::Atom));
	printKeyValue("Body", lp.eqs(Var_t::Body));
	printKeyValue("Other", lp.eqs(Var_t::Hybrid));
	popObject();
	popObject(); // LP
}